

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int upb_JsonDecodeDetectingNonconformance
              (char *buf,size_t size,upb_Message *msg,upb_MessageDef *m,upb_DefPool *symtab,
              int options,upb_Arena *arena,upb_Status *status)

{
  int iVar1;
  jsondec d;
  
  if (((ulong)msg->field_0 & 1) == 0) {
    if (size == 0) {
      iVar1 = 1;
    }
    else {
      d.end = buf + size;
      d.arena = arena;
      d.status = status;
      d.depth = 0x40;
      d.result = 0;
      d.line = 1;
      d.debug_field = (upb_FieldDef *)0x0;
      d.is_first = false;
      d.ptr = buf;
      d.symtab = symtab;
      d.line_begin = buf;
      d.options = options;
      iVar1 = upb_JsonDecoder_Decode(&d,msg,m);
    }
    return iVar1;
  }
  __assert_fail("!upb_Message_IsFrozen(msg)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                ,0x616,
                "int upb_JsonDecodeDetectingNonconformance(const char *, size_t, upb_Message *, const upb_MessageDef *, const upb_DefPool *, int, upb_Arena *, upb_Status *)"
               );
}

Assistant:

int upb_JsonDecodeDetectingNonconformance(const char* buf, size_t size,
                                          upb_Message* msg,
                                          const upb_MessageDef* m,
                                          const upb_DefPool* symtab,
                                          int options, upb_Arena* arena,
                                          upb_Status* status) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  jsondec d;

  if (size == 0) return true;

  d.ptr = buf;
  d.end = buf + size;
  d.arena = arena;
  d.symtab = symtab;
  d.status = status;
  d.options = options;
  d.depth = 64;
  d.result = kUpb_JsonDecodeResult_Ok;
  d.line = 1;
  d.line_begin = d.ptr;
  d.debug_field = NULL;
  d.is_first = false;

  return upb_JsonDecoder_Decode(&d, msg, m);
}